

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O0

void bounded_buffer_init(bounded_buffer_t *bb,int size)

{
  entry_t **ppeVar1;
  int local_18;
  int i;
  int size_local;
  bounded_buffer_t *bb_local;
  
  ppeVar1 = (entry_t **)malloc((long)size << 3);
  bb->entries = ppeVar1;
  for (local_18 = 0; local_18 < size; local_18 = local_18 + 1) {
    bb->entries[local_18] = (entry_t *)0x0;
  }
  bb->size = size;
  bb->tail = 0;
  bb->head = 0;
  pthread_mutex_init((pthread_mutex_t *)&bb->lock,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&bb->has_space,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&bb->has_items,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

void bounded_buffer_init(bounded_buffer_t* bb, int size)
{
    bb->entries = (entry_t**) malloc(size * sizeof(entry_t*));
    for (int i=0; i < size; i++)
        bb->entries[i] = NULL;
    bb->size = size;
    bb->head = bb->tail = 0;
    pthread_mutex_init(&bb->lock, NULL);
    pthread_cond_init (&bb->has_space, NULL);
    pthread_cond_init (&bb->has_items, NULL);
}